

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_BinaryFile(char *s,int32_t startPos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  uint uVar7;
  ulong __off;
  char *fullPath;
  size_t size;
  char *local_38;
  size_t local_30;
  
  __off = (ulong)(uint)startPos;
  if (startPos < 0) {
    error("Start position cannot be negative (%d)\n",__off);
    __off = 0;
  }
  bVar1 = checkcodesection();
  if (!bVar1) {
    return;
  }
  __stream = (FILE *)0x0;
  local_38 = (char *)0x0;
  local_30 = 0;
  bVar1 = fstk_FindFile(s,&local_38,&local_30);
  if (bVar1) {
    __stream = fopen(local_38,"rb");
  }
  free(local_38);
  if (__stream == (FILE *)0x0) {
    if (generatedMissingIncludes == true) {
      if (verbose == true) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        printf("Aborting (-MG) on INCBIN file \'%s\' (%s)\n",s,pcVar6);
      }
      failedOnMissingInclude = true;
      return;
    }
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    error("Error opening INCBIN file \'%s\': %s\n",s,pcVar6);
    return;
  }
  iVar2 = fseek(__stream,0,2);
  uVar7 = (uint)__off;
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0x1d) {
      pcVar6 = strerror(*piVar5);
      error("Error determining size of INCBIN file \'%s\': %s\n",s,pcVar6);
    }
    iVar2 = -1;
    while (uVar7 != 0) {
      fgetc(__stream);
      uVar7 = (int)__off - 1;
      __off = (ulong)uVar7;
    }
  }
  else {
    lVar4 = ftell(__stream);
    iVar2 = (int)lVar4;
    if (iVar2 < (int)uVar7) {
      error("Specified start position is greater than length of file\n");
      goto LAB_00113944;
    }
    fseek(__stream,__off,0);
    bVar1 = reserveSpace(iVar2 - uVar7);
    if (!bVar1) goto LAB_00113944;
  }
  iVar3 = fgetc(__stream);
  while (iVar3 != -1) {
    if (iVar2 == -1) {
      growSection(1);
    }
    currentSection->data[loadOffset + curOffset] = (uint8_t)iVar3;
    growSection(1);
    iVar3 = fgetc(__stream);
  }
  iVar2 = ferror(__stream);
  if (iVar2 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    error("Error reading INCBIN file \'%s\': %s\n",s,pcVar6);
  }
LAB_00113944:
  fclose(__stream);
  return;
}

Assistant:

void sect_BinaryFile(char const *s, int32_t startPos)
{
	if (startPos < 0) {
		error("Start position cannot be negative (%" PRId32 ")\n", startPos);
		startPos = 0;
	}
	if (!checkcodesection())
		return;

	char *fullPath = NULL;
	size_t size = 0;
	FILE *f = NULL;

	if (fstk_FindFile(s, &fullPath, &size))
		f = fopen(fullPath, "rb");
	free(fullPath);

	if (!f) {
		if (generatedMissingIncludes) {
			if (verbose)
				printf("Aborting (-MG) on INCBIN file '%s' (%s)\n", s, strerror(errno));
			failedOnMissingInclude = true;
			return;
		}
		error("Error opening INCBIN file '%s': %s\n", s, strerror(errno));
		return;
	}

	int32_t fsize = -1;
	int byte;

	if (fseek(f, 0, SEEK_END) != -1) {
		fsize = ftell(f);

		if (startPos > fsize) {
			error("Specified start position is greater than length of file\n");
			goto cleanup;
		}

		fseek(f, startPos, SEEK_SET);
		if (!reserveSpace(fsize - startPos))
			goto cleanup;
	} else {
		if (errno != ESPIPE)
			error("Error determining size of INCBIN file '%s': %s\n",
			      s, strerror(errno));
		// The file isn't seekable, so we'll just skip bytes
		while (startPos--)
			(void)fgetc(f);
	}

	while ((byte = fgetc(f)) != EOF) {
		if (fsize == -1)
			growSection(1);
		writebyte(byte);
	}

	if (ferror(f))
		error("Error reading INCBIN file '%s': %s\n", s, strerror(errno));

cleanup:
	fclose(f);
}